

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.cc
# Opt level: O0

void __thiscall
TlbImport::load(TlbImport *this,istream *stream,config_set *config,Registry *registry)

{
  byte bVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  MalformedXML *this_00;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [32];
  xmlDocPtr local_e8;
  xmlDocPtr doc;
  stringbuf local_c0 [8];
  stringbuf buffer;
  string local_48 [8];
  string document;
  Registry *registry_local;
  config_set *config_local;
  istream *stream_local;
  TlbImport *this_local;
  
  std::__cxx11::string::string(local_48);
  while( true ) {
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) break;
    std::__cxx11::stringbuf::stringbuf(local_c0);
    std::istream::operator>>((istream *)stream,(streambuf *)local_c0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator+=(local_48,(string *)&doc);
    std::__cxx11::string::~string((string *)&doc);
    std::__cxx11::stringbuf::~stringbuf(local_c0);
  }
  uVar3 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::length();
  local_e8 = (xmlDocPtr)xmlParseMemory(uVar3,uVar2);
  if (local_e8 == (xmlDocPtr)0x0) {
    local_10a = 1;
    this_00 = (MalformedXML *)__cxa_allocate_exception(0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"",&local_109);
    Parsing::MalformedXML::MalformedXML(this_00,(string *)local_108);
    local_10a = 0;
    __cxa_throw(this_00,&Parsing::MalformedXML::typeinfo,Parsing::MalformedXML::~MalformedXML);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"",&local_131);
  anon_unknown.dwarf_bff3::parse((string *)local_130,local_e8,registry);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  xmlFreeDoc(local_e8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void TlbImport::load
    ( std::istream& stream
    , utilmm::config_set const& config
    , Typelib::Registry& registry)
{
    // libXML is not really iostream-compatible :(
    // Get the whole document
    std::string document;

    while (stream.good())
    {
        std::stringbuf buffer;
        stream >> &buffer;
        document += buffer.str();
    }
    xmlDocPtr doc = xmlParseMemory(document.c_str(), document.length());
    if (!doc)
        throw Parsing::MalformedXML();

    try
    {
        // giving "" as source_id is rather counterproductive... later
        // errormessages are not informative anymore...
        parse("", doc, registry);
        xmlFreeDoc(doc);
    }
    catch(...)
    {
        xmlFreeDoc(doc);
        throw;
    }
}